

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::IntegerStateQueryVerifiers::GetBooleanVerifier::verifyInteger4Mask
          (GetBooleanVerifier *this,TestContext *testCtx,GLenum name,GLint reference0,
          bool enableRef0,GLint reference1,bool enableRef1,GLint reference2,bool enableRef2,
          GLint reference3,bool enableRef3)

{
  ostringstream *this_00;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  StateQueryMemoryWriteGuard<unsigned_char[4]> boolVector4;
  MessageBuilder local_1b0;
  
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char[4]>::
  StateQueryMemoryWriteGuard(&boolVector4);
  glu::CallLogWrapper::glGetBooleanv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,boolVector4.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char[4]>::verifyValidity
                    (&boolVector4,testCtx);
  if ((bVar1) &&
     (((((enableRef0 && ((bool)boolVector4.m_value[0] != (reference0 != 0))) ||
        ((enableRef1 && ((bool)boolVector4.m_value[1] != (reference1 != 0))))) ||
       ((enableRef2 && ((bool)boolVector4.m_value[2] != (reference2 != 0))))) ||
      ((enableRef3 && ((bool)boolVector4.m_value[3] != (reference3 != 0))))))) {
    local_1b0.m_log = testCtx->m_log;
    this_00 = &local_1b0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,"// ERROR: expected ");
    pcVar3 = "GL_FALSE";
    pcVar2 = "GL_FALSE";
    if (reference0 != 0) {
      pcVar2 = "GL_TRUE";
    }
    if (!enableRef0) {
      pcVar2 = " - ";
    }
    std::operator<<((ostream *)this_00,pcVar2);
    std::operator<<((ostream *)this_00,", ");
    pcVar2 = "GL_FALSE";
    if (reference1 != 0) {
      pcVar2 = "GL_TRUE";
    }
    if (!enableRef1) {
      pcVar2 = " - ";
    }
    std::operator<<((ostream *)this_00,pcVar2);
    std::operator<<((ostream *)this_00,", ");
    pcVar2 = "GL_FALSE";
    if (reference2 != 0) {
      pcVar2 = "GL_TRUE";
    }
    if (!enableRef2) {
      pcVar2 = " - ";
    }
    std::operator<<((ostream *)this_00,pcVar2);
    std::operator<<((ostream *)this_00,", ");
    if (reference3 != 0) {
      pcVar3 = "GL_TRUE";
    }
    pcVar2 = " - ";
    if (enableRef3) {
      pcVar2 = pcVar3;
    }
    std::operator<<((ostream *)this_00,pcVar2);
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid boolean value");
    }
  }
  return;
}

Assistant:

void GetBooleanVerifier::verifyInteger4Mask (tcu::TestContext& testCtx, GLenum name, GLint reference0, bool enableRef0, GLint reference1, bool enableRef1, GLint reference2, bool enableRef2, GLint reference3, bool enableRef3)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLboolean[4]> boolVector4;
	glGetBooleanv(name, boolVector4);

	if (!boolVector4.verifyValidity(testCtx))
		return;

	const GLboolean referenceAsGLBoolean[] =
	{
		reference0 ? (GLboolean)GL_TRUE : (GLboolean)GL_FALSE,
		reference1 ? (GLboolean)GL_TRUE : (GLboolean)GL_FALSE,
		reference2 ? (GLboolean)GL_TRUE : (GLboolean)GL_FALSE,
		reference3 ? (GLboolean)GL_TRUE : (GLboolean)GL_FALSE,
	};

	if ((enableRef0 && (boolVector4[0] != referenceAsGLBoolean[0])) ||
		(enableRef1 && (boolVector4[1] != referenceAsGLBoolean[1])) ||
		(enableRef2 && (boolVector4[2] != referenceAsGLBoolean[2])) ||
		(enableRef3 && (boolVector4[3] != referenceAsGLBoolean[3])))
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected "
			<< (enableRef0 ? (referenceAsGLBoolean[0] ? "GL_TRUE" : "GL_FALSE") : " - ") << ", "
			<< (enableRef1 ? (referenceAsGLBoolean[1] ? "GL_TRUE" : "GL_FALSE") : " - ") << ", "
			<< (enableRef2 ? (referenceAsGLBoolean[2] ? "GL_TRUE" : "GL_FALSE") : " - ") << ", "
			<< (enableRef3 ? (referenceAsGLBoolean[3] ? "GL_TRUE" : "GL_FALSE") : " - ") << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid boolean value");
	}
}